

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void __thiscall
Centaurus::ChaserEM64T<char>::emit_machine
          (ChaserEM64T<char> *this,X86Assembler *as,Grammar<char> *grammar,Identifier *id,
          CompositeATN<char> *catn,Label *rejectlabel,MyConstPool *pool)

{
  pointer pAVar1;
  uint uVar2;
  mapped_type *pmVar3;
  long lVar4;
  long lVar5;
  X86Gp *args;
  Operand_ *o0;
  X86Gp *args_2;
  X86Gp *args_3;
  int i;
  int iVar6;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  Label finishlabel;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  NFABase<Centaurus::DFAState<char>_> local_118;
  anon_union_16_7_ed616b9d_for_Operand__0 local_f8;
  anon_union_16_7_ed616b9d_for_Operand__0 local_e8;
  ATNPath local_d0;
  ATNPath local_b0;
  X86Gp local_90;
  X86Gp local_80;
  X86Gp local_70;
  X86Gp local_60;
  X86Gp local_50;
  X86Gp local_40;
  
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar3 = std::__detail::
           _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&grammar->m_networks,id);
  for (iVar6 = 0;
      lVar4 = (long)(pmVar3->m_nodes).
                    super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pmVar3->m_nodes).
                    super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, iVar6 < (int)(lVar4 / 0x98);
      iVar6 = iVar6 + 1) {
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_118,as);
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::emplace_back<asmjit::Label>
              (&statelabels,(Label *)&local_118);
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&finishlabel,as,lVar4 % 0x98);
  lVar4 = 0;
  do {
    lVar5 = (long)(pmVar3->m_nodes).
                  super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pmVar3->m_nodes).
                  super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(lVar5 / 0x98) <= lVar4) {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&finishlabel,lVar5 % 0x98);
      std::_Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>::~_Vector_base
                (&statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>);
      return;
    }
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
              (as,statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar4);
    pAVar1 = (pmVar3->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    switch(pAVar1[lVar4].m_type) {
    case Nonterminal:
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x500));
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x510));
      local_e8._packed[0] = (UInt64)0x808000031;
      local_e8._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
      iVar6 = Grammar<char>::get_machine_id(grammar,&pAVar1[lVar4].m_invoke);
      local_f8._packed[0] = (UInt64)0x608000031;
      local_f8._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
      call_abs<void_const*(*)(void*,int,void_const*),asmjit::X86Gp,int,asmjit::X86Gp>
                (as,request_nonterminal,(X86Gp *)&local_e8._any,iVar6,(X86Gp *)&local_f8._any);
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x510));
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x500));
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
                 (Operand_ *)(asmjit::x86OpData + 0x480));
      break;
    case LiteralTerminal:
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4f0),
                 (Operand_ *)(asmjit::x86OpData + 0x4e0));
      MatchRoutineEM64T<char>::emit(as,pool,rejectlabel,&pAVar1[lVar4].m_literal);
      if (-1 < pAVar1[lVar4].m_localid) {
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4e0));
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x500));
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x510));
        args = &local_40;
        args_2 = &local_50;
        args_3 = &local_60;
LAB_00120c21:
        (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0] =
             (UInt64)0x808000031;
        (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2 =
             (anon_union_8_2_78723da6_for_MemData_2)0;
        iVar6 = pAVar1[lVar4].m_localid;
        (args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0] =
             (UInt64)0x708000031;
        (args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2 =
             (anon_union_8_2_78723da6_for_MemData_2)0;
        (args_3->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0] =
             (UInt64)0x608000031;
        (args_3->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2 =
             (anon_union_8_2_78723da6_for_MemData_2)0;
        call_abs<void(*)(void*,int,void_const*,void_const*),asmjit::X86Gp,int,asmjit::X86Gp,asmjit::X86Gp>
                  (as,push_terminal,args,iVar6,args_2,args_3);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x510));
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x500));
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x4e0));
      }
      break;
    case RegularTerminal:
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4f0),
                 (Operand_ *)(asmjit::x86OpData + 0x4e0));
      DFA<char>::DFA((DFA<char> *)&local_118,&pAVar1[lVar4].m_nfa,true);
      DFARoutineEM64T<char>::emit(as,rejectlabel,(DFA<char> *)&local_118,pool);
      NFABase<Centaurus::DFAState<char>_>::~NFABase(&local_118);
      if (-1 < pAVar1[lVar4].m_localid) {
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4e0));
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x500));
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x510));
        args = &local_70;
        args_2 = &local_80;
        args_3 = &local_90;
        goto LAB_00120c21;
      }
      break;
    case WhiteSpace:
      SkipRoutineEM64T<char>::emit(as);
    }
    lVar5 = *(long *)&pAVar1[lVar4].m_transitions.
                      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                      ._M_impl.super__Vector_impl_data;
    uVar2 = (uint)(((long)pAVar1[lVar4].m_transitions.
                          super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lVar5) / 0x18);
    if (uVar2 == 1) {
      o0 = (Operand_ *)
           (statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
            super__Vector_impl_data._M_start + *(int *)(lVar5 + 0xc));
LAB_00120d0b:
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11e,o0);
    }
    else {
      o0 = (Operand_ *)&finishlabel;
      if (uVar2 == 0) goto LAB_00120d0b;
      exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (lVar5 = 0; (ulong)(~((int)uVar2 >> 0x1f) & uVar2) * 0x18 - lVar5 != 0;
          lVar5 = lVar5 + 0x18) {
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
                  ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
                   &exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>,
                   statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   *(int *)(*(long *)&pAVar1[lVar4].m_transitions.
                                      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                                      ._M_impl.super__Vector_impl_data + 0xc + lVar5));
      }
      ATNPath::ATNPath(&local_d0,id,(int)lVar4);
      CompositeATN<char>::convert_atn_path(&local_b0,catn,&local_d0);
      LookaheadDFA<char>::LookaheadDFA((LookaheadDFA<char> *)&local_118,catn,&local_b0,true);
      LDFARoutineEM64T<char>::emit
                (as,rejectlabel,(LookaheadDFA<char> *)&local_118,
                 (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
                 &exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>);
      NFABase<Centaurus::LDFAState<char>_>::~NFABase
                ((NFABase<Centaurus::LDFAState<char>_> *)&local_118);
      std::
      vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ::~vector(&local_b0.
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               );
      std::
      vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ::~vector(&local_d0.
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               );
      std::_Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>::~_Vector_base
                (&exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>);
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void ChaserEM64T<TCHAR>::emit_machine(asmjit::X86Assembler& as, const Grammar<TCHAR>& grammar, const Identifier& id, const CompositeATN<TCHAR>& catn, asmjit::Label& rejectlabel, MyConstPool& pool)
{
	std::vector<asmjit::Label> statelabels;

    const ATNMachine<TCHAR>& machine = grammar[id];

	for (int i = 0; i < machine.get_node_num(); i++)
	{
		statelabels.push_back(as.newLabel());
	}

    asmjit::Label finishlabel = as.newLabel();

	for (int i = 0; i < machine.get_node_num(); i++)
	{
		as.bind(statelabels[i]);

		const ATNNode<TCHAR>& node = machine.get_node(i);

		switch (node.type())
		{
		case ATNNodeType::Blank:
			break;
		case ATNNodeType::LiteralTerminal:
			as.mov(CHECKPOINT_REG, INPUT_REG);
			MatchRoutineEM64T<TCHAR>::emit(as, pool, rejectlabel, node.get_literal());
            if (node.get_id() >= 0)
            {
                as.push(INPUT_REG);
                as.push(CONTEXT_REG);
				as.push(STACK_BACKUP_REG);
                call_abs(as, push_terminal, CONTEXT_REG, node.get_id(), CHECKPOINT_REG, INPUT_REG);
				as.pop(STACK_BACKUP_REG);
				as.pop(CONTEXT_REG);
                as.pop(INPUT_REG);
            }
            break;
		case ATNNodeType::RegularTerminal:
            as.mov(CHECKPOINT_REG, INPUT_REG);
			DFARoutineEM64T<TCHAR>::emit(as, rejectlabel, DFA<TCHAR>(node.get_nfa()), pool);
            if (node.get_id() >= 0)
            {
                as.push(INPUT_REG);
                as.push(CONTEXT_REG);
				as.push(STACK_BACKUP_REG);
				call_abs(as, push_terminal, CONTEXT_REG, node.get_id(), CHECKPOINT_REG, INPUT_REG);
				as.pop(STACK_BACKUP_REG);
				as.pop(CONTEXT_REG);
                as.pop(INPUT_REG);
            }
            break;
		case ATNNodeType::WhiteSpace:
			SkipRoutineEM64T<TCHAR>::emit(as);
			break;
		case ATNNodeType::Nonterminal:
            as.push(CONTEXT_REG);
			as.push(STACK_BACKUP_REG);
            call_abs(as, request_nonterminal, CONTEXT_REG, grammar.get_machine_id(node.get_invoke()), INPUT_REG);
			as.pop(STACK_BACKUP_REG);
			as.pop(CONTEXT_REG);
            as.mov(INPUT_REG, asmjit::x86::rax);
			break;
		}

		int outbound_num = node.get_transitions().size();
		if (outbound_num == 0)
		{
			as.jmp(finishlabel);
		}
		else if (outbound_num == 1)
		{
			as.jmp(statelabels[node.get_transition(0).dest()]);
		}
		else
		{
			std::vector<asmjit::Label> exitlabels;

			for (int j = 0; j < outbound_num; j++)
			{
				exitlabels.push_back(statelabels[node.get_transition(j).dest()]);
			}

			LDFARoutineEM64T<TCHAR>::emit(as, rejectlabel, LookaheadDFA<TCHAR>(catn, catn.convert_atn_path(ATNPath(id, i))), exitlabels);
		}
	}
    as.bind(finishlabel);
}